

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

vector<int,_std::allocator<int>_> *
cppcms::json::traits<std::vector<int,_std::allocator<int>_>_>::get
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,value *v)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar2 = (long *)cppcms::json::value::array();
  std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,plVar2[1] - *plVar2 >> 3);
  lVar3 = *plVar2;
  if (plVar2[1] != lVar3) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      iVar1 = traits<int>::get((value *)(lVar3 + uVar5 * 8));
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = iVar1;
      uVar5 = (ulong)uVar4;
      lVar3 = *plVar2;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)(plVar2[1] - lVar3 >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> get(value const &v)
		{
			std::vector<T> result;
			json::array const &a=v.array();
			result.resize(a.size());
			for(unsigned i=0;i<a.size();i++) 
				result[i]=a[i].get_value<T>();
			return result;
		}